

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O1

void __thiscall
WordSplitNTest_random_view_Test<signed_char>::TestBody
          (WordSplitNTest_random_view_Test<signed_char> *this)

{
  pointer pbVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  vector<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::allocator<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>_>
  split_result;
  RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  data;
  unsigned_long local_100;
  long *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
  local_d8;
  container_type_conflict15 local_c8;
  RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  local_b0;
  
  RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::RandomWordTestData(&local_b0,'\0',0,0);
  jessilib::
  word_split_n<std::vector,_std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,_signed_char>
            (&local_c8,
             (__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              )local_b0.m_str._M_dataplus._M_p,
             (__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              )(local_b0.m_str._M_dataplus._M_p + local_b0.m_str._M_string_length),'\0',4);
  local_f8 = (long *)((long)local_c8.
                            super__Vector_base<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::allocator<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_c8.
                            super__Vector_base<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::allocator<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_100 = 5;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e8,"split_result.size()","n + 1",(unsigned_long *)&local_f8,
             &local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xc1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (local_f8 != (long *)0x0) {
      (**(code **)(*local_f8 + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  lVar2 = 0;
  lVar4 = 0;
  do {
    testing::internal::
    CmpHelperEQ<std::basic_string_view<signed_char,std::char_traits<signed_char>>,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
              ((internal *)local_e8,"split_result[index]","data.m_tokens[index]",
               (basic_string_view<signed_char,_std::char_traits<signed_char>_> *)
               ((long)&(local_c8.
                        super__Vector_base<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::allocator<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_len + lVar2),
               (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                *)((long)&((local_b0.m_tokens.
                            super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      pcVar3 = "";
      if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
                 ,0xc3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
      if (local_f8 != (long *)0x0) {
        (**(code **)(*local_f8 + 8))();
      }
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
    pbVar1 = local_c8.
             super__Vector_base<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::allocator<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = lVar4 + 0x20;
    lVar2 = lVar2 + 0x10;
  } while (lVar4 != 0x80);
  RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::get_remainder((basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                   *)local_e8,&local_b0,4);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<signed_char,std::char_traits<signed_char>>,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
            ((internal *)&local_f8,"split_result[n]","data.get_remainder(n)",pbVar1 + 4,
             (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
              *)local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
                     *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
  }
  if (local_f8._0_1_ == (Message)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xc6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((long *)CONCAT71(local_e8._1_7_,local_e8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_e8._1_7_,local_e8[0]) + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  if (local_c8.
      super__Vector_base<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::allocator<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::allocator<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::allocator<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::allocator<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.m_token_indexes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ::~vector(&local_b0.m_tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)local_b0.m_str._M_dataplus._M_p != &local_b0.m_str.field_2) {
    operator_delete(local_b0.m_str._M_dataplus._M_p,local_b0.m_str.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)local_b0.m_delim._M_dataplus._M_p != &local_b0.m_delim.field_2) {
    operator_delete(local_b0.m_delim._M_dataplus._M_p,
                    local_b0.m_delim.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(WordSplitNTest, random_view) {
	RandomWordTestData<TypeParam> data{};
	constexpr size_t n = 4;
	std::vector<std::basic_string_view<TypeParam>> split_result = word_split_n_view(data.m_str, default_delim<TypeParam>, n);

	// Tokens shall be same up until last one (n + 1)
	EXPECT_EQ(split_result.size(), n + 1);
	for (size_t index = 0; index != n; ++index) {
		EXPECT_EQ(split_result[index], data.m_tokens[index]);
	}

	EXPECT_EQ(split_result[n], data.get_remainder(n));
}